

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O3

JsErrorCode
WScriptJsrt::LoadModuleFromString(LPCSTR fileName,LPCSTR fileContent,LPCSTR fullName,bool isFile)

{
  DWORD_PTR DVar1;
  key_type pvVar2;
  JsErrorCode JVar3;
  JsErrorCode jsErrorCode;
  iterator iVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  PAL_FILE *pPVar7;
  LPCWSTR pWVar8;
  mapped_type *fullDirNarrow;
  mapped_type *ppvVar9;
  _Alloc_hider local_68;
  JsValueRef errorObject;
  JsValueRef local_48;
  JsValueRef specifier;
  key_type local_38;
  JsModuleRecord requestModule;
  
  DVar1 = sourceContext;
  sourceContext = sourceContext + 1;
  local_38 = (mapped_type)0x0;
  if (fullName != (LPCSTR)0x0) {
    fileName = fullName;
  }
  std::__cxx11::string::string((string *)&stack0xffffffffffffff98,fileName,(allocator *)&local_48);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
          ::find(&moduleRecordMap_abi_cxx11_._M_t,(key_type *)&stack0xffffffffffffff98);
  if (local_68._M_p != &stack0xffffffffffffffa8) {
    operator_delete(local_68._M_p);
  }
  if ((_Rb_tree_header *)iVar4._M_node ==
      &moduleRecordMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    local_48 = (JsValueRef)0x0;
    if (fullName == (LPCSTR)0x0 || !isFile) {
LAB_0010fd1d:
      jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtInitializeModuleRecord)
                              ((JsModuleRecord)0x0,local_48,&local_38);
      if (jsErrorCode == JsNoError) {
        if (fullName != (LPCSTR)0x0) {
          fullDirNarrow =
               std::
               map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&moduleDirMap_abi_cxx11_,&local_38);
          GetDir(fullName,fullDirNarrow);
        }
        pvVar2 = local_38;
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff98,fileName,(allocator *)((long)&specifier + 7));
        ppvVar9 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                  ::operator[](&moduleRecordMap_abi_cxx11_,(key_type *)&stack0xffffffffffffff98);
        *ppvVar9 = pvVar2;
        if (local_68._M_p != &stack0xffffffffffffffa8) {
          operator_delete(local_68._M_p);
        }
        pmVar6 = std::
                 map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
                 ::operator[](&moduleErrMap,&local_38);
        *pmVar6 = RootModule;
        goto LAB_0010fc10;
      }
    }
    else {
      sVar5 = strlen(fullName);
      jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)(fullName,sVar5,&local_48);
      if (jsErrorCode == JsNoError) goto LAB_0010fd1d;
    }
    pPVar7 = PAL_get_stderr(0);
    pWVar8 = Helpers::JsErrorCodeToString(jsErrorCode);
    PAL_fwprintf(pPVar7,L"ERROR: errorCode failed. JsErrorCode=0x%x (%s)\n",(ulong)jsErrorCode,
                 pWVar8);
    pPVar7 = PAL_get_stderr(0);
    PAL_fflush(pPVar7);
  }
  else {
    local_38 = *(key_type *)(iVar4._M_node + 2);
LAB_0010fc10:
    local_68._M_p = (pointer)0x0;
    if (fileContent == (LPCSTR)0x0) {
      jsErrorCode = JsNoError;
      (*ChakraRTInterface::m_jsApiHooks.pfJsrtParseModuleSource)
                (local_38,DVar1,(byte *)0x0,0,JsParseModuleSourceFlags_DataIsUTF8,
                 &stack0xffffffffffffff98._M_p);
    }
    else {
      sVar5 = strlen(fileContent);
      JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtParseModuleSource)
                        (local_38,DVar1,(byte *)fileContent,(uint)sVar5,
                         JsParseModuleSourceFlags_DataIsUTF8,&stack0xffffffffffffff98._M_p);
      jsErrorCode = JsNoError;
      if ((((JVar3 != JsNoError) && (local_68._M_p != (pointer)0x0)) &&
          (HostConfigFlags::flags.IgnoreScriptErrorCode == false)) &&
         (pmVar6 = std::
                   map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
                   ::operator[](&moduleErrMap,&local_38), jsErrorCode = JsNoError,
         *pmVar6 == RootModule)) {
        (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetException)(local_68._M_p);
        pmVar6 = std::
                 map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
                 ::operator[](&moduleErrMap,&local_38);
        *pmVar6 = ErroredModule;
        jsErrorCode = JVar3;
      }
    }
  }
  return jsErrorCode;
}

Assistant:

JsErrorCode WScriptJsrt::LoadModuleFromString(LPCSTR fileName, LPCSTR fileContent, LPCSTR fullName, bool isFile)
{
    DWORD_PTR dwSourceCookie = WScriptJsrt::GetNextSourceContext();
    JsModuleRecord requestModule = JS_INVALID_REFERENCE;
    LPCSTR moduleRecordKey = fullName ? fullName : fileName;
    auto moduleRecordEntry = moduleRecordMap.find(std::string(moduleRecordKey));
    JsErrorCode errorCode = JsNoError;

    // we need to create a new moduleRecord if the specifier (fileName) is not found;
    // otherwise we'll use the old one.
    if (moduleRecordEntry == moduleRecordMap.end())
    {
        JsValueRef specifier = nullptr;
        if (isFile && fullName)
        {
            errorCode = ChakraRTInterface::JsCreateString(
                fullName, strlen(fullName), &specifier);
        }
        if (errorCode == JsNoError)
        {
            errorCode = ChakraRTInterface::JsInitializeModuleRecord(
                nullptr, specifier, &requestModule);
        }
        if (errorCode == JsNoError)
        {
            if (fullName)
            {
                GetDir(fullName, &moduleDirMap[requestModule]);
            }

            moduleRecordMap[std::string(moduleRecordKey)] = requestModule;
            moduleErrMap[requestModule] = RootModule;
        }
    }
    else
    {
        requestModule = moduleRecordEntry->second;
    }
    IfJsrtErrorFailLogAndRetErrorCode(errorCode);
    JsValueRef errorObject = JS_INVALID_REFERENCE;

    // ParseModuleSource is sync, while additional fetch & evaluation are async.
    unsigned int fileContentLength = (fileContent == nullptr) ? 0 : (unsigned int)strlen(fileContent);
 
    errorCode = ChakraRTInterface::JsParseModuleSource(requestModule, dwSourceCookie, (LPBYTE)fileContent,
        fileContentLength, JsParseModuleSourceFlags_DataIsUTF8, &errorObject);
    if ((errorCode != JsNoError) && errorObject != JS_INVALID_REFERENCE && fileContent != nullptr && !HostConfigFlags::flags.IgnoreScriptErrorCode && moduleErrMap[requestModule] == RootModule)
    {
        ChakraRTInterface::JsSetException(errorObject);
        moduleErrMap[requestModule] = ErroredModule;
        return errorCode;
    }
    return JsNoError;
}